

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls13_enc.cc
# Opt level: O3

bool bssl::ssl_ech_accept_confirmation
               (SSL_HANDSHAKE *hs,Span<unsigned_char> out,Span<const_unsigned_char> client_random,
               SSLTranscript *transcript,bool is_hrr,Span<const_unsigned_char> msg,size_t offset)

{
  ulong uVar1;
  ulong uVar2;
  string_view label;
  Span<const_unsigned_char> hash;
  bool bVar3;
  int iVar4;
  EVP_MD *pEVar5;
  size_t salt_len;
  ulong cnt;
  size_t cnt_00;
  Span<const_unsigned_char> secret_00;
  Span<unsigned_char> out_00;
  uint context_len;
  ScopedEVP_MD_CTX ctx;
  size_t secret_len;
  uint8_t secret [64];
  uint8_t context [64];
  uint local_12c;
  EVP_MD_CTX local_128;
  uchar *local_f8;
  uchar *local_f0;
  size_t local_e8;
  size_t local_e0;
  uchar *local_d8;
  size_t sStack_d0;
  size_t local_c8;
  char *pcStack_c0;
  uint8_t local_b8 [64];
  uchar local_78 [72];
  
  local_128.pctx = (EVP_PKEY_CTX *)out.size_;
  local_f8 = out.data_;
  local_e8 = client_random.size_;
  local_f0 = client_random.data_;
  uVar1 = offset + 8;
  if (msg.size_ < uVar1) {
    ERR_put_error(0x10,0,0x44,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_enc.cc"
                  ,0x290);
    return false;
  }
  cnt_00 = 4;
  if (msg.size_ < 4) {
    cnt_00 = msg.size_;
  }
  local_128.update = (_func_1088 *)hs;
  iVar4 = SSL_is_dtls(hs->ssl);
  uVar2 = (ulong)(iVar4 != 0) * 8 + 4;
  if (msg.size_ < uVar2) {
    abort();
  }
  cnt = offset - uVar2;
  if (msg.size_ - uVar2 < offset - uVar2) {
    cnt = msg.size_ - uVar2;
  }
  EVP_MD_CTX_init(&local_128);
  pEVar5 = SSLTranscript::Digest(transcript);
  bVar3 = SSLTranscript::CopyToHashContext(transcript,(EVP_MD_CTX *)&local_128,pEVar5);
  if ((((bVar3) && (iVar4 = EVP_DigestUpdate(&local_128,msg.data_,cnt_00), iVar4 != 0)) &&
      (iVar4 = EVP_DigestUpdate(&local_128,msg.data_ + uVar2,cnt), iVar4 != 0)) &&
     ((iVar4 = EVP_DigestUpdate(&local_128,"",8), iVar4 != 0 &&
      (iVar4 = EVP_DigestUpdate(&local_128,msg.data_ + uVar1,msg.size_ - uVar1), iVar4 != 0)))) {
    iVar4 = EVP_DigestFinal_ex(&local_128,local_78,&local_12c);
    if (iVar4 != 0) {
      pEVar5 = SSLTranscript::Digest(transcript);
      salt_len = SSLTranscript::DigestLen(transcript);
      iVar4 = HKDF_extract(local_b8,&local_e0,pEVar5,local_f0,local_e8,"",salt_len);
      if (iVar4 != 0) {
        if (local_128.pctx != (EVP_PKEY_CTX *)0x8) {
          __assert_fail("out.size() == ECH_CONFIRMATION_SIGNAL_LEN",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_enc.cc"
                        ,0x2b0,
                        "bool bssl::ssl_ech_accept_confirmation(const SSL_HANDSHAKE *, Span<uint8_t>, Span<const uint8_t>, const SSLTranscript &, bool, Span<const uint8_t>, size_t)"
                       );
        }
        pEVar5 = SSLTranscript::Digest(transcript);
        pcStack_c0 = "ech accept confirmation";
        if (is_hrr) {
          pcStack_c0 = "hrr ech accept confirmation";
        }
        local_c8 = (ulong)is_hrr * 4 + 0x17;
        sStack_d0 = (size_t)local_12c;
        local_d8 = local_78;
        iVar4 = SSL_is_dtls(*(SSL **)local_128.update);
        label._M_str = pcStack_c0;
        label._M_len = local_c8;
        hash.size_ = sStack_d0;
        hash.data_ = local_d8;
        secret_00.size_ = local_e0;
        secret_00.data_ = local_b8;
        out_00.size_ = 8;
        out_00.data_ = local_f8;
        bVar3 = hkdf_expand_label(out_00,pEVar5,secret_00,label,hash,iVar4 != 0);
        goto LAB_0016714a;
      }
    }
  }
  bVar3 = false;
LAB_0016714a:
  EVP_MD_CTX_cleanup(&local_128);
  return bVar3;
}

Assistant:

bool ssl_ech_accept_confirmation(const SSL_HANDSHAKE *hs, Span<uint8_t> out,
                                 Span<const uint8_t> client_random,
                                 const SSLTranscript &transcript, bool is_hrr,
                                 Span<const uint8_t> msg, size_t offset) {
  // See draft-ietf-tls-esni-13, sections 7.2 and 7.2.1.
  static const uint8_t kZeros[EVP_MAX_MD_SIZE] = {0};

  // We hash |msg|, with bytes from |offset| zeroed.
  if (msg.size() < offset + ECH_CONFIRMATION_SIGNAL_LEN) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return false;
  }

  // We represent DTLS messages with the longer DTLS 1.2 header, but DTLS 1.3
  // removes the extra fields from the transcript.
  auto header = msg.subspan(0, SSL3_HM_HEADER_LENGTH);
  size_t full_header_len =
      SSL_is_dtls(hs->ssl) ? DTLS1_HM_HEADER_LENGTH : SSL3_HM_HEADER_LENGTH;
  auto before_zeros = msg.subspan(full_header_len, offset - full_header_len);
  auto after_zeros = msg.subspan(offset + ECH_CONFIRMATION_SIGNAL_LEN);

  uint8_t context[EVP_MAX_MD_SIZE];
  unsigned context_len;
  ScopedEVP_MD_CTX ctx;
  if (!transcript.CopyToHashContext(ctx.get(), transcript.Digest()) ||
      !EVP_DigestUpdate(ctx.get(), header.data(), header.size()) ||
      !EVP_DigestUpdate(ctx.get(), before_zeros.data(), before_zeros.size()) ||
      !EVP_DigestUpdate(ctx.get(), kZeros, ECH_CONFIRMATION_SIGNAL_LEN) ||
      !EVP_DigestUpdate(ctx.get(), after_zeros.data(), after_zeros.size()) ||
      !EVP_DigestFinal_ex(ctx.get(), context, &context_len)) {
    return false;
  }

  uint8_t secret[EVP_MAX_MD_SIZE];
  size_t secret_len;
  if (!HKDF_extract(secret, &secret_len, transcript.Digest(),
                    client_random.data(), client_random.size(), kZeros,
                    transcript.DigestLen())) {
    return false;
  }

  assert(out.size() == ECH_CONFIRMATION_SIGNAL_LEN);
  return hkdf_expand_label(
      out, transcript.Digest(), Span(secret, secret_len),
      is_hrr ? "hrr ech accept confirmation" : "ech accept confirmation",
      Span(context, context_len), SSL_is_dtls(hs->ssl));
}